

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCastDecimalToFloatingPoint<duckdb::hugeint_t,double>
          (duckdb *this,hugeint_t input,double *result,uint8_t scale)

{
  bool bVar1;
  ulong uVar2;
  Hugeint *this_00;
  InvalidInputException *pIVar3;
  double *pdVar4;
  hugeint_t lhs;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  hugeint_t input_04;
  hugeint_t hVar5;
  double result_2;
  hugeint_t mod;
  hugeint_t div;
  double local_90;
  string local_88;
  double local_68;
  ulong local_60;
  double *local_58;
  hugeint_t local_50;
  hugeint_t local_40;
  
  lhs.upper = input.lower;
  pdVar4 = result;
  local_88._M_dataplus._M_p = (pointer)this;
  local_88._M_string_length = lhs.upper;
  hugeint_t::hugeint_t(&local_40,0x20000000000000);
  bVar1 = hugeint_t::operator<=((hugeint_t *)&local_88,&local_40);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_50,-0x20000000000000);
    bVar1 = hugeint_t::operator>=((hugeint_t *)&local_88,&local_50);
  }
  else {
    bVar1 = false;
  }
  if (((char)result == '\0') || (bVar1 != false)) {
    hVar5.upper = (int64_t)&local_40;
    hVar5.lower = lhs.upper;
    bVar1 = Hugeint::TryCast<double>((Hugeint *)this,hVar5,pdVar4);
    if (!bVar1) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.upper = (int64_t)pdVar4;
      input_00.lower = lhs.upper;
      CastExceptionText<duckdb::hugeint_t,double>(&local_88,this,input_00);
      InvalidInputException::InvalidInputException(pIVar3,&local_88);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    *(double *)input.upper =
         (double)local_40.lower /
         *(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + ((ulong)result & 0xff) * 8);
  }
  else {
    local_60 = (ulong)result & 0xff;
    uVar2 = (ulong)(uint)((int)local_60 << 4);
    pdVar4 = *(double **)(Hugeint::POWERS_OF_TEN + uVar2 + 8);
    hVar5 = *(hugeint_t *)(Hugeint::POWERS_OF_TEN + uVar2);
    local_58 = (double *)input.upper;
    hugeint_t::hugeint_t(&local_40,0);
    hugeint_t::hugeint_t(&local_50,0);
    lhs.lower = (uint64_t)this;
    local_40 = Hugeint::DivMod(lhs,hVar5,&local_50);
    input_01.lower = local_40.upper;
    this_00 = (Hugeint *)local_40.lower;
    input_03.upper = (int64_t)&local_90;
    input_03.lower = input_01.lower;
    bVar1 = Hugeint::TryCast<double>(this_00,input_03,pdVar4);
    if (!bVar1) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.upper = (int64_t)pdVar4;
      CastExceptionText<duckdb::hugeint_t,double>(&local_88,(duckdb *)this_00,input_01);
      InvalidInputException::InvalidInputException(pIVar3,&local_88);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_68 = local_90;
    input_04.upper = (int64_t)&local_90;
    input_04.lower = local_50.upper;
    bVar1 = Hugeint::TryCast<double>((Hugeint *)local_50.lower,input_04,pdVar4);
    if (!bVar1) {
      pdVar4 = local_58;
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_02.upper = (int64_t)pdVar4;
      input_02.lower = local_50.upper;
      CastExceptionText<duckdb::hugeint_t,double>(&local_88,(duckdb *)local_50.lower,input_02);
      InvalidInputException::InvalidInputException(pIVar3,&local_88);
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    *local_58 = local_68 +
                local_90 / *(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + local_60 * 8);
  }
  return true;
}

Assistant:

bool TryCastDecimalToFloatingPoint(SRC input, DST &result, uint8_t scale) {
	if (IsRepresentableExactly<SRC, DST>(input, DST(0.0)) || scale == 0) {
		// Fast path, integer is representable exaclty as a float/double
		result = Cast::Operation<SRC, DST>(input) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
		return true;
	}
	auto power_of_ten = GetPowerOfTen(input, scale);

	SRC div = 0;
	SRC mod = 0;
	GetDivMod(input, power_of_ten, div, mod);

	result = Cast::Operation<SRC, DST>(div) +
	         Cast::Operation<SRC, DST>(mod) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
	return true;
}